

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_avx2.c
# Opt level: O2

void av1_build_compound_diffwtd_mask_highbd_avx2
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,uint8_t *src0,int src0_stride,
               uint8_t *src1,int src1_stride,int h,int w,int bd)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  ulong uVar4;
  int j;
  int iVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  
  if (0xf < w) {
    lVar2 = (long)src0 * 2;
    lVar3 = (long)src1 * 2;
    if (bd == 8) {
      iVar5 = 0;
      if (h < 1) {
        h = 0;
      }
      uVar4 = (ulong)(uint)w;
      if (mask_type == '\x01') {
        auVar8._8_2_ = 0xffda;
        auVar8._0_8_ = 0xffdaffdaffdaffda;
        auVar8._10_2_ = 0xffda;
        auVar8._12_2_ = 0xffda;
        auVar8._14_2_ = 0xffda;
        auVar8._16_2_ = 0xffda;
        auVar8._18_2_ = 0xffda;
        auVar8._20_2_ = 0xffda;
        auVar8._22_2_ = 0xffda;
        auVar8._24_2_ = 0xffda;
        auVar8._26_2_ = 0xffda;
        auVar8._28_2_ = 0xffda;
        auVar8._30_2_ = 0xffda;
        auVar10._8_2_ = 0x26;
        auVar10._0_8_ = 0x26002600260026;
        auVar10._10_2_ = 0x26;
        auVar10._12_2_ = 0x26;
        auVar10._14_2_ = 0x26;
        auVar10._16_2_ = 0x26;
        auVar10._18_2_ = 0x26;
        auVar10._20_2_ = 0x26;
        auVar10._22_2_ = 0x26;
        auVar10._24_2_ = 0x26;
        auVar10._26_2_ = 0x26;
        auVar10._28_2_ = 0x26;
        auVar10._30_2_ = 0x26;
        auVar13._8_2_ = 0x40;
        auVar13._0_8_ = 0x40004000400040;
        auVar13._10_2_ = 0x40;
        auVar13._12_2_ = 0x40;
        auVar13._14_2_ = 0x40;
        auVar13._16_2_ = 0x40;
        auVar13._18_2_ = 0x40;
        auVar13._20_2_ = 0x40;
        auVar13._22_2_ = 0x40;
        auVar13._24_2_ = 0x40;
        auVar13._26_2_ = 0x40;
        auVar13._28_2_ = 0x40;
        auVar13._30_2_ = 0x40;
        for (iVar5 = 0; iVar5 != h; iVar5 = iVar5 + 1) {
          for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 0x10) {
            auVar15 = vpsubw_avx2(*(undefined1 (*) [32])(lVar2 + uVar6 * 2),
                                  *(undefined1 (*) [32])(lVar3 + uVar6 * 2));
            auVar15 = vpabsw_avx2(auVar15);
            auVar15 = vpsraw_avx2(auVar15,4);
            auVar15 = vpmaxsw_avx2(auVar15,auVar8);
            auVar15 = vpaddw_avx2(auVar15,auVar10);
            auVar15 = vpsubusw_avx2(auVar13,auVar15);
            auVar7 = vpackuswb_avx(auVar15._0_16_,auVar15._16_16_);
            *(undefined1 (*) [16])(mask + uVar6) = auVar7;
          }
          mask = mask + uVar4;
          lVar3 = lVar3 + (long)src1_stride * 2;
          lVar2 = lVar2 + (long)src0_stride * 2;
        }
      }
      else {
        auVar9._8_2_ = 0xffda;
        auVar9._0_8_ = 0xffdaffdaffdaffda;
        auVar9._10_2_ = 0xffda;
        auVar9._12_2_ = 0xffda;
        auVar9._14_2_ = 0xffda;
        auVar9._16_2_ = 0xffda;
        auVar9._18_2_ = 0xffda;
        auVar9._20_2_ = 0xffda;
        auVar9._22_2_ = 0xffda;
        auVar9._24_2_ = 0xffda;
        auVar9._26_2_ = 0xffda;
        auVar9._28_2_ = 0xffda;
        auVar9._30_2_ = 0xffda;
        auVar12._8_2_ = 0x26;
        auVar12._0_8_ = 0x26002600260026;
        auVar12._10_2_ = 0x26;
        auVar12._12_2_ = 0x26;
        auVar12._14_2_ = 0x26;
        auVar12._16_2_ = 0x26;
        auVar12._18_2_ = 0x26;
        auVar12._20_2_ = 0x26;
        auVar12._22_2_ = 0x26;
        auVar12._24_2_ = 0x26;
        auVar12._26_2_ = 0x26;
        auVar12._28_2_ = 0x26;
        auVar12._30_2_ = 0x26;
        auVar14._8_2_ = 0x40;
        auVar14._0_8_ = 0x40004000400040;
        auVar14._10_2_ = 0x40;
        auVar14._12_2_ = 0x40;
        auVar14._14_2_ = 0x40;
        auVar14._16_2_ = 0x40;
        auVar14._18_2_ = 0x40;
        auVar14._20_2_ = 0x40;
        auVar14._22_2_ = 0x40;
        auVar14._24_2_ = 0x40;
        auVar14._26_2_ = 0x40;
        auVar14._28_2_ = 0x40;
        auVar14._30_2_ = 0x40;
        for (; iVar5 != h; iVar5 = iVar5 + 1) {
          for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 0x10) {
            auVar15 = vpsubw_avx2(*(undefined1 (*) [32])(lVar2 + uVar6 * 2),
                                  *(undefined1 (*) [32])(lVar3 + uVar6 * 2));
            auVar15 = vpabsw_avx2(auVar15);
            auVar15 = vpsraw_avx2(auVar15,4);
            auVar15 = vpmaxsw_avx2(auVar15,auVar9);
            auVar15 = vpaddw_avx2(auVar15,auVar12);
            auVar15 = vpminuw_avx2(auVar15,auVar14);
            auVar7 = vpackuswb_avx(auVar15._0_16_,auVar15._16_16_);
            *(undefined1 (*) [16])(mask + uVar6) = auVar7;
          }
          mask = mask + uVar4;
          lVar3 = lVar3 + (long)src1_stride * 2;
          lVar2 = lVar2 + (long)src0_stride * 2;
        }
      }
    }
    else {
      iVar5 = 0;
      if (h < 1) {
        h = 0;
      }
      auVar7._8_8_ = (long)(bd + -4);
      auVar7._0_8_ = (long)(bd + -4);
      uVar4 = (ulong)(uint)w;
      if (mask_type == '\x01') {
        auVar11._8_2_ = 0x26;
        auVar11._0_8_ = 0x26002600260026;
        auVar11._10_2_ = 0x26;
        auVar11._12_2_ = 0x26;
        auVar11._14_2_ = 0x26;
        auVar11._16_2_ = 0x26;
        auVar11._18_2_ = 0x26;
        auVar11._20_2_ = 0x26;
        auVar11._22_2_ = 0x26;
        auVar11._24_2_ = 0x26;
        auVar11._26_2_ = 0x26;
        auVar11._28_2_ = 0x26;
        auVar11._30_2_ = 0x26;
        auVar16._8_2_ = 0x40;
        auVar16._0_8_ = 0x40004000400040;
        auVar16._10_2_ = 0x40;
        auVar16._12_2_ = 0x40;
        auVar16._14_2_ = 0x40;
        auVar16._16_2_ = 0x40;
        auVar16._18_2_ = 0x40;
        auVar16._20_2_ = 0x40;
        auVar16._22_2_ = 0x40;
        auVar16._24_2_ = 0x40;
        auVar16._26_2_ = 0x40;
        auVar16._28_2_ = 0x40;
        auVar16._30_2_ = 0x40;
        for (iVar5 = 0; iVar5 != h; iVar5 = iVar5 + 1) {
          for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 0x10) {
            auVar15 = vpsubw_avx2(*(undefined1 (*) [32])(lVar2 + uVar6 * 2),
                                  *(undefined1 (*) [32])(lVar3 + uVar6 * 2));
            auVar15 = vpabsw_avx2(auVar15);
            auVar15 = vpsraw_avx2(auVar15,auVar7);
            auVar15 = vpaddw_avx2(auVar15,auVar11);
            auVar15 = vpmaxsw_avx2(auVar15,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar15 = vpsubusw_avx2(auVar16,auVar15);
            auVar1 = vpackuswb_avx(auVar15._0_16_,auVar15._16_16_);
            *(undefined1 (*) [16])(mask + uVar6) = auVar1;
          }
          mask = mask + uVar4;
          lVar3 = lVar3 + (long)src1_stride * 2;
          lVar2 = lVar2 + (long)src0_stride * 2;
        }
      }
      else {
        auVar15._8_2_ = 0x26;
        auVar15._0_8_ = 0x26002600260026;
        auVar15._10_2_ = 0x26;
        auVar15._12_2_ = 0x26;
        auVar15._14_2_ = 0x26;
        auVar15._16_2_ = 0x26;
        auVar15._18_2_ = 0x26;
        auVar15._20_2_ = 0x26;
        auVar15._22_2_ = 0x26;
        auVar15._24_2_ = 0x26;
        auVar15._26_2_ = 0x26;
        auVar15._28_2_ = 0x26;
        auVar15._30_2_ = 0x26;
        auVar17._8_2_ = 0x40;
        auVar17._0_8_ = 0x40004000400040;
        auVar17._10_2_ = 0x40;
        auVar17._12_2_ = 0x40;
        auVar17._14_2_ = 0x40;
        auVar17._16_2_ = 0x40;
        auVar17._18_2_ = 0x40;
        auVar17._20_2_ = 0x40;
        auVar17._22_2_ = 0x40;
        auVar17._24_2_ = 0x40;
        auVar17._26_2_ = 0x40;
        auVar17._28_2_ = 0x40;
        auVar17._30_2_ = 0x40;
        for (; iVar5 != h; iVar5 = iVar5 + 1) {
          for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 0x10) {
            auVar11 = vpsubw_avx2(*(undefined1 (*) [32])(lVar2 + uVar6 * 2),
                                  *(undefined1 (*) [32])(lVar3 + uVar6 * 2));
            auVar11 = vpabsw_avx2(auVar11);
            auVar11 = vpsraw_avx2(auVar11,auVar7);
            auVar11 = vpaddw_avx2(auVar11,auVar15);
            auVar11 = vpmaxsw_avx2(auVar11,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar11 = vpminsw_avx2(auVar11,auVar17);
            auVar1 = vpackuswb_avx(auVar11._0_16_,auVar11._16_16_);
            *(undefined1 (*) [16])(mask + uVar6) = auVar1;
          }
          mask = mask + uVar4;
          lVar3 = lVar3 + (long)src1_stride * 2;
          lVar2 = lVar2 + (long)src0_stride * 2;
        }
      }
    }
    return;
  }
  av1_build_compound_diffwtd_mask_highbd_ssse3
            (mask,mask_type,src0,src0_stride,src1,src1_stride,h,w,bd);
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_highbd_avx2(
    uint8_t *mask, DIFFWTD_MASK_TYPE mask_type, const uint8_t *src0,
    int src0_stride, const uint8_t *src1, int src1_stride, int h, int w,
    int bd) {
  if (w < 16) {
    av1_build_compound_diffwtd_mask_highbd_ssse3(
        mask, mask_type, src0, src0_stride, src1, src1_stride, h, w, bd);
  } else {
    assert(mask_type == DIFFWTD_38 || mask_type == DIFFWTD_38_INV);
    assert(bd >= 8);
    assert((w % 16) == 0);
    const __m256i y0 = _mm256_setzero_si256();
    const __m256i yAOM_BLEND_A64_MAX_ALPHA =
        _mm256_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
    const int mask_base = 38;
    const __m256i ymask_base = _mm256_set1_epi16(mask_base);
    const uint16_t *ssrc0 = CONVERT_TO_SHORTPTR(src0);
    const uint16_t *ssrc1 = CONVERT_TO_SHORTPTR(src1);
    if (bd == 8) {
      if (mask_type == DIFFWTD_38_INV) {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 16) {
            __m256i s0 = _mm256_loadu_si256((const __m256i *)&ssrc0[j]);
            __m256i s1 = _mm256_loadu_si256((const __m256i *)&ssrc1[j]);
            __m256i diff = _mm256_srai_epi16(
                _mm256_abs_epi16(_mm256_sub_epi16(s0, s1)), DIFF_FACTOR_LOG2);
            __m256i m = _mm256_min_epi16(
                _mm256_max_epi16(y0, _mm256_add_epi16(diff, ymask_base)),
                yAOM_BLEND_A64_MAX_ALPHA);
            m = _mm256_sub_epi16(yAOM_BLEND_A64_MAX_ALPHA, m);
            m = _mm256_packus_epi16(m, m);
            m = _mm256_permute4x64_epi64(m, _MM_SHUFFLE(0, 0, 2, 0));
            __m128i m0 = _mm256_castsi256_si128(m);
            _mm_storeu_si128((__m128i *)&mask[j], m0);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      } else {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 16) {
            __m256i s0 = _mm256_loadu_si256((const __m256i *)&ssrc0[j]);
            __m256i s1 = _mm256_loadu_si256((const __m256i *)&ssrc1[j]);
            __m256i diff = _mm256_srai_epi16(
                _mm256_abs_epi16(_mm256_sub_epi16(s0, s1)), DIFF_FACTOR_LOG2);
            __m256i m = _mm256_min_epi16(
                _mm256_max_epi16(y0, _mm256_add_epi16(diff, ymask_base)),
                yAOM_BLEND_A64_MAX_ALPHA);
            m = _mm256_packus_epi16(m, m);
            m = _mm256_permute4x64_epi64(m, _MM_SHUFFLE(0, 0, 2, 0));
            __m128i m0 = _mm256_castsi256_si128(m);
            _mm_storeu_si128((__m128i *)&mask[j], m0);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      }
    } else {
      const __m128i xshift = _mm_set1_epi64x(bd - 8 + DIFF_FACTOR_LOG2);
      if (mask_type == DIFFWTD_38_INV) {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 16) {
            __m256i s0 = _mm256_loadu_si256((const __m256i *)&ssrc0[j]);
            __m256i s1 = _mm256_loadu_si256((const __m256i *)&ssrc1[j]);
            __m256i diff = _mm256_sra_epi16(
                _mm256_abs_epi16(_mm256_sub_epi16(s0, s1)), xshift);
            __m256i m = _mm256_min_epi16(
                _mm256_max_epi16(y0, _mm256_add_epi16(diff, ymask_base)),
                yAOM_BLEND_A64_MAX_ALPHA);
            m = _mm256_sub_epi16(yAOM_BLEND_A64_MAX_ALPHA, m);
            m = _mm256_packus_epi16(m, m);
            m = _mm256_permute4x64_epi64(m, _MM_SHUFFLE(0, 0, 2, 0));
            __m128i m0 = _mm256_castsi256_si128(m);
            _mm_storeu_si128((__m128i *)&mask[j], m0);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      } else {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 16) {
            __m256i s0 = _mm256_loadu_si256((const __m256i *)&ssrc0[j]);
            __m256i s1 = _mm256_loadu_si256((const __m256i *)&ssrc1[j]);
            __m256i diff = _mm256_sra_epi16(
                _mm256_abs_epi16(_mm256_sub_epi16(s0, s1)), xshift);
            __m256i m = _mm256_min_epi16(
                _mm256_max_epi16(y0, _mm256_add_epi16(diff, ymask_base)),
                yAOM_BLEND_A64_MAX_ALPHA);
            m = _mm256_packus_epi16(m, m);
            m = _mm256_permute4x64_epi64(m, _MM_SHUFFLE(0, 0, 2, 0));
            __m128i m0 = _mm256_castsi256_si128(m);
            _mm_storeu_si128((__m128i *)&mask[j], m0);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      }
    }
  }
}